

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * read_spirv_file_stdin(void)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *in_RDI;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_440;
  const_iterator local_438;
  size_t local_420;
  size_t ret;
  uint32_t tmp [256];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer;
  
  tmp[0xff]._3_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  while (local_420 = fread(&ret,4,0x100,_stdin), local_420 != 0) {
    local_440._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_438,&local_440);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int*,void>
              (in_RDI,local_438,(uint *)&ret,tmp + (local_420 - 2));
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI;
}

Assistant:

static vector<uint32_t> read_spirv_file_stdin()
{
#ifdef _WIN32
	setmode(fileno(stdin), O_BINARY);
#endif

	vector<uint32_t> buffer;
	uint32_t tmp[256];
	size_t ret;

	while ((ret = fread(tmp, sizeof(uint32_t), 256, stdin)))
		buffer.insert(buffer.end(), tmp, tmp + ret);

	return buffer;
}